

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O1

void __thiscall DetectorSS::Merge(DetectorSS *this,DetectorSS *detector)

{
  byte *pbVar1;
  int iVar2;
  uchar **ppuVar3;
  key_tp **ppkVar4;
  int **ppiVar5;
  uchar *puVar6;
  uchar *puVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  DetectorSS *ss;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  
  if (0 < (this->ss_).depth) {
    ppuVar3 = (detector->ss_).counts;
    ppkVar4 = (detector->ss_).skey;
    ppiVar5 = (detector->ss_).level;
    lVar11 = 0;
    do {
      if (0 < (this->ss_).width) {
        lVar12 = 0;
        do {
          iVar2 = (this->ss_).offsets[(this->ss_).c];
          if (0 < iVar2) {
            puVar6 = (this->ss_).counts[lVar11];
            puVar7 = ppuVar3[lVar11];
            iVar14 = 0;
            do {
              uVar10 = iVar14 + iVar2 * (int)lVar12;
              iVar13 = (int)uVar10 >> 3;
              uVar10 = uVar10 & 7;
              pbVar1 = puVar6 + iVar13;
              *pbVar1 = *pbVar1 | (byte)(0xff >> uVar10) & puVar7[iVar13];
              iVar14 = (iVar14 - uVar10) + 8;
            } while (iVar14 < iVar2);
          }
          piVar8 = (this->ss_).level[lVar11];
          piVar9 = ppiVar5[lVar11];
          if (piVar8[lVar12] <= piVar9[lVar12]) {
            (this->ss_).skey[lVar11][lVar12] = ppkVar4[lVar11][lVar12];
            piVar8[lVar12] = piVar9[lVar12];
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->ss_).width);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->ss_).depth);
  }
  return;
}

Assistant:

void DetectorSS::Merge(DetectorSS* detector) {
	DetectorSS* ss = (DetectorSS*)detector;
	unsigned char** counts = ss->GetTable();
	key_tp** skey = ss->GetKey();
	int** level = ss->GetLevel();
	for (int i = 0; i < ss_.depth; i++) {
		for (int j = 0; j < ss_.width; j++) {
			Mergebmp(ss_.counts[i], counts[i], j * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
			if (ss_.level[i][j] <= level[i][j]) {
				ss_.skey[i][j] = skey[i][j];
				ss_.level[i][j] = level[i][j];
			}
		}
	}
}